

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzhamtest.cpp
# Opt level: O2

int main_internal(string_array *cmd_line,int num_helper_threads,ilzham *lzham_dll)

{
  pointer pbVar1;
  double dVar2;
  comp_options options_00;
  comp_options options_01;
  comp_options options_02;
  ilzham *piVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  lzham_compress_level lVar7;
  lzham_compress_status_t lVar8;
  pointer pbVar9;
  ulong uVar10;
  timer_ticks tVar11;
  timer_ticks tVar12;
  FILE *pFVar13;
  __off64_t _Var14;
  __off64_t _Var15;
  undefined1 recursive;
  ulong in_RCX;
  string_array *files_00;
  lzham_uint8 *plVar16;
  uint uVar17;
  pointer pcVar18;
  char *pMsg;
  char *pcVar19;
  ulong uVar20;
  const_iterator __position;
  comp_options options;
  size_t cmp_len;
  bool bStack_8e0;
  undefined3 uStack_8df;
  int iStack_8dc;
  bool bStack_8d8;
  bool bStack_8d7;
  bool bStack_8d6;
  bool local_8d5;
  bool local_8d4;
  bool bStack_8d3;
  undefined2 uStack_8d2;
  uint local_8c4;
  ilzham *local_8c0;
  undefined4 local_8b4;
  lzham_uint32 local_8b0;
  lzham_uint32 comp_adler32;
  long local_8a8;
  long local_8a0;
  string_array files;
  size_t decomp_size;
  undefined7 uStack_870;
  undefined1 uStack_869;
  undefined3 uStack_868;
  timer_ticks local_860;
  string local_858;
  lzham_uint8 cmp_buf [1024];
  lzham_uint8 decomp_buf [1024];
  
  options.m_comp_level = LZHAM_COMP_LEVEL_UBER;
  options.m_dict_size_log2 = 0x1c;
  options.m_compute_adler32_during_decomp = true;
  options.m_unbuffered_decompression = false;
  options.m_verify_compressed_data = false;
  options.m_force_polar_codes = false;
  options.m_randomize_params = false;
  options.m_extreme_parsing = false;
  options.m_deterministic_parsing = false;
  __position._M_current =
       (cmd_line->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  pbVar9 = (cmd_line->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  options.m_max_helper_threads = num_helper_threads;
  piVar3 = lzham_dll;
  if (pbVar9 == __position._M_current) {
    print_usage();
    putchar(10);
    puts("LZHAM simple memory to memory compression test");
    local_858.field_2._8_4_ = 0;
    local_858.field_2._M_allocated_capacity = 0;
    local_858._M_dataplus._M_p = (pointer)0x1c0000001c;
    local_858._M_string_length = 0x100000004;
    cmp_len = 0x400;
    comp_adler32 = 0;
    lVar8 = (*lzham_dll->lzham_compress_memory)
                      ((lzham_compress_params *)&local_858,cmp_buf,&cmp_len,
                       (lzham_uint8 *)
                       "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                       ,0x58,&comp_adler32);
    if (lVar8 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
      printf("Uncompressed size: %u\nCompressed size: %u\n",0x58,cmp_len & 0xffffffff);
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)CONCAT44(options.m_dict_size_log2,0x10);
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)(((ulong)(uint)options._8_4_ & 0xff) << 0x20);
      decomp_size = 0x400;
      local_8b0 = 0;
      lVar8 = (*lzham_dll->lzham_decompress_memory)
                        ((lzham_decompress_params *)&files,decomp_buf,&decomp_size,cmp_buf,cmp_len,
                         &local_8b0);
      if (lVar8 == LZHAM_COMP_STATUS_FIRST_SUCCESS_OR_FAILURE_CODE) {
        if (((comp_adler32 == local_8b0) && (decomp_size == 0x58)) &&
           (iVar6 = bcmp(decomp_buf,
                         "This is a test.This is a test.This is a test.1234567This is a test.This is a test.123456"
                         ,0x58), iVar6 == 0)) {
          puts("Compression test succeeded.");
          return 0;
        }
        pcVar19 = "Compression test failed!\n";
        goto LAB_0010aa15;
      }
    }
    print_error("Compression test failed with status %i!\n",(ulong)lVar8);
    return 1;
  }
  while( true ) {
    local_8c0 = piVar3;
    recursive = (undefined1)in_RCX;
    if ((int)((ulong)((long)pbVar9 - (long)__position._M_current) >> 5) < 1) {
      print_error("No mode specified!\n");
      print_usage();
      return 1;
    }
    pcVar19 = ((__position._M_current)->_M_dataplus)._M_p;
    if (*pcVar19 != 0x2d) break;
    if ((__position._M_current)->_M_string_length < 2) {
switchD_0010a607_caseD_66:
      pMsg = "Invalid option: %s\n";
LAB_0010a83d:
      print_error(pMsg,pcVar19);
      return 1;
    }
    iVar6 = tolower((int)pcVar19[1]);
    uVar17 = options.m_max_helper_threads;
    switch(iVar6) {
    case 99:
      options._8_4_ = options._8_4_ & 0xffffff00;
      break;
    case 100:
      iVar6 = atoi(pcVar19 + 2);
      in_RCX = (ulong)(iVar6 - 0xfU);
      if (0xe < iVar6 - 0xfU) {
        pMsg = "Invalid dictionary size: %s\n";
        goto LAB_0010a83d;
      }
      options.m_dict_size_log2 = iVar6;
      uVar17 = options.m_max_helper_threads;
      break;
    case 0x65:
      options.m_deterministic_parsing = true;
      break;
    default:
      goto switchD_0010a607_caseD_66;
    case 0x6d:
      lVar7 = atoi(pcVar19 + 2);
      if (LZHAM_COMP_LEVEL_UBER < lVar7) {
        pMsg = "Invalid compression level: %s\n";
        goto LAB_0010a83d;
      }
      options.m_comp_level = lVar7;
      uVar17 = options.m_max_helper_threads;
      break;
    case 0x70:
      options.m_force_polar_codes = true;
      break;
    case 0x72:
      options.m_randomize_params = true;
      break;
    case 0x73:
      uVar17 = atoi(pcVar19 + 2);
      srand(uVar17);
      printf("Using random seed: %i\n",(ulong)uVar17);
      __position._M_current =
           (cmd_line->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      uVar17 = options.m_max_helper_threads;
      break;
    case 0x74:
      uVar17 = atoi(pcVar19 + 2);
      if (0x10 < uVar17) {
        pMsg = "Invalid number of helper threads: %s\n";
        goto LAB_0010a83d;
      }
      break;
    case 0x75:
      options.m_unbuffered_decompression = true;
      break;
    case 0x76:
      options.m_verify_compressed_data = true;
      break;
    case 0x78:
      options.m_extreme_parsing = true;
    }
    options.m_max_helper_threads = uVar17;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::erase(cmd_line,__position);
    __position._M_current =
         (cmd_line->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (cmd_line->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    piVar3 = local_8c0;
  }
  if ((__position._M_current)->_M_string_length != 1) {
LAB_0010a836:
    pMsg = "Invalid mode: %s\n";
    goto LAB_0010a83d;
  }
  iVar6 = tolower((int)*pcVar19);
  if (iVar6 == 0x61) {
    iVar6 = 2;
  }
  else if (iVar6 == 99) {
    iVar6 = 0;
  }
  else {
    if (iVar6 != 100) goto LAB_0010a836;
    iVar6 = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::erase(cmd_line,__position);
  puts("Using options:");
  comp_options::print(&options);
  putchar(10);
  piVar3 = local_8c0;
  bVar4 = options.m_randomize_params;
  pbVar9 = (cmd_line->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar10 = (long)(cmd_line->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar9;
  if (iVar6 == 2) {
    if ((long)uVar10 >> 5 == 1) {
      pcVar19 = (pbVar9->_M_dataplus)._M_p;
      decomp_size._0_4_ = options.m_comp_level;
      decomp_size._4_4_ = options.m_dict_size_log2;
      uStack_870 = (undefined7)CONCAT44(options.m_max_helper_threads,options._8_4_);
      uStack_869 = (undefined1)((uint)options.m_max_helper_threads >> 0x18);
      _uStack_869 = CONCAT31(CONCAT12(options.m_force_polar_codes,
                                      CONCAT11(options.m_verify_compressed_data,
                                               options.m_unbuffered_decompression)),uStack_869);
      local_8b4 = CONCAT22(options._22_2_,
                           CONCAT11(options.m_deterministic_parsing,options.m_extreme_parsing));
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      files.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_858,pcVar19,(allocator<char> *)decomp_buf);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)cmp_buf,"*",(allocator<char> *)&cmp_len);
      bVar5 = find_files(&local_858,(string *)&files,files_00,(bool)recursive);
      std::__cxx11::string::~string((string *)cmp_buf);
      std::__cxx11::string::~string((string *)&local_858);
      if (bVar5) {
        tVar11 = timer::get_ticks();
        tVar12 = timer::get_init_ticks();
        local_860 = tVar11;
        sprintf((char *)cmp_buf,"__comp_temp_%u__.tmp",tVar12 & 0xffffffff);
        sprintf((char *)decomp_buf,"__decomp_temp_%u__.tmp",tVar12 & 0xffffffff);
        local_8a0 = 0;
        local_8a8 = 0;
        local_8c4 = 0;
        uVar10 = 0;
        while (pbVar9 = files.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              uVar20 = (long)files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)files.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5, uVar10 < uVar20) {
          pbVar1 = files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + uVar10;
          uVar17 = (int)uVar10 + 1;
          printf("***** [%u of %u] Compressing file \"%s\" to \"%s\"\n",(ulong)uVar17,
                 uVar20 & 0xffffffff,
                 files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10]._M_dataplus._M_p,cmp_buf);
          pFVar13 = fopen64(pbVar9[uVar10]._M_dataplus._M_p,"rb");
          if (pFVar13 == (FILE *)0x0) {
            printf("Skipping unreadable file \"%s\"\n",(pbVar1->_M_dataplus)._M_p);
            uVar10 = (ulong)uVar17;
          }
          else {
            fseek(pFVar13,0,2);
            _Var14 = ftello64(pFVar13);
            fclose(pFVar13);
            bVar5 = ensure_file_is_writable((char *)cmp_buf);
            piVar3 = local_8c0;
            if (!bVar5) {
              plVar16 = cmp_buf;
LAB_0010aec3:
              print_error("Unable to create file \"%s\"!\n",plVar16);
              goto LAB_0010ae4a;
            }
            bStack_8d8 = SUB41((uint)_uStack_869 >> 8,0);
            bStack_8d7 = SUB41((uint)_uStack_869 >> 0x10,0);
            bStack_8d6 = SUB41((uint)_uStack_869 >> 0x18,0);
            cmp_len = decomp_size;
            _bStack_8e0 = (undefined4)uStack_870;
            iStack_8dc = (int)(CONCAT17(uStack_869,uStack_870) >> 0x20);
            local_8d5 = bVar4;
            local_8d4 = SUB41(local_8b4,0);
            bStack_8d3 = SUB41((uint)local_8b4 >> 8,0);
            uStack_8d2 = (undefined2)((uint)local_8b4 >> 0x10);
            if ((bVar4 & 1U) != 0) {
              uVar17 = rand();
              cmp_len = CONCAT44(cmp_len._4_4_,uVar17 % 5);
              iVar6 = rand();
              cmp_len = CONCAT44(iVar6 % 0xf + 0xf,(undefined4)cmp_len);
              iStack_8dc = rand();
              iStack_8dc = iStack_8dc % 0x11;
              iVar6 = rand();
              bStack_8d8 = (bool)((byte)iVar6 & 1);
              iVar6 = rand();
              bStack_8d6 = (bool)((byte)iVar6 & 1);
              iVar6 = rand();
              bStack_8d3 = (bool)((byte)iVar6 & 1);
              comp_options::print((comp_options *)&cmp_len);
            }
            bVar5 = compress_streaming(piVar3,(pbVar1->_M_dataplus)._M_p,(char *)cmp_buf,
                                       (comp_options *)&cmp_len);
            if (!bVar5) {
              pcVar18 = (pbVar1->_M_dataplus)._M_p;
              pcVar19 = "Failed compressing file \"%s\" to \"%s\"\n";
LAB_0010aef0:
              plVar16 = cmp_buf;
LAB_0010aef8:
              print_error(pcVar19,pcVar18,plVar16);
              goto LAB_0010ae4a;
            }
            if (bStack_8d7 == true) {
              printf("Decompressing file \"%s\" to \"%s\"\n",cmp_buf,decomp_buf);
              bVar5 = ensure_file_is_writable((char *)decomp_buf);
              if (!bVar5) {
                plVar16 = decomp_buf;
                goto LAB_0010aec3;
              }
              options_02.m_verify_compressed_data = bStack_8d7;
              options_02.m_unbuffered_decompression = bStack_8d8;
              options_02.m_force_polar_codes = bStack_8d6;
              options_02.m_randomize_params = local_8d5;
              options_02.m_extreme_parsing = local_8d4;
              options_02.m_deterministic_parsing = bStack_8d3;
              options_02._22_2_ = uStack_8d2;
              options_02.m_max_helper_threads = iStack_8dc;
              options_02.m_compute_adler32_during_decomp = bStack_8e0;
              options_02._9_3_ = uStack_8df;
              options_02.m_comp_level = (undefined4)cmp_len;
              options_02.m_dict_size_log2 = cmp_len._4_4_;
              bVar5 = decompress_file(piVar3,(char *)cmp_buf,(char *)decomp_buf,options_02);
              pcVar18 = (pbVar1->_M_dataplus)._M_p;
              if (!bVar5) {
                pcVar19 = "Failed decompressing file \"%s\" to \"%s\"\n";
                plVar16 = decomp_buf;
                goto LAB_0010aef8;
              }
              printf("Comparing file \"%s\" to \"%s\"\n",decomp_buf);
              bVar5 = compare_files((char *)decomp_buf,(pbVar1->_M_dataplus)._M_p);
              if (!bVar5) {
                pcVar18 = (pbVar1->_M_dataplus)._M_p;
                pcVar19 = 
                "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n";
                goto LAB_0010aef0;
              }
              puts("Decompressed file compared OK to original file.");
            }
            pFVar13 = fopen64((char *)cmp_buf,"rb");
            if (pFVar13 == (FILE *)0x0) {
              _Var15 = 0;
            }
            else {
              fseek(pFVar13,0,2);
              _Var15 = ftello64(pFVar13);
              fclose(pFVar13);
            }
            local_8c4 = local_8c4 + 1;
            local_8a8 = local_8a8 + _Var14;
            local_8a0 = local_8a0 + _Var15;
            putchar(10);
            uVar10 = (ulong)((int)uVar10 + 1);
          }
        }
        tVar11 = timer::get_ticks();
        dVar2 = timer::ticks_to_secs(tVar11 - local_860);
        printf("Test successful: %f secs\n",SUB84(dVar2,0));
        printf("Total files processed: %u\n",(ulong)local_8c4);
        printf("Total source size: %llu\n",local_8a8);
        printf("Total compressed size: %llu\n",local_8a0);
        remove((char *)cmp_buf);
        remove((char *)decomp_buf);
LAB_0010ae4a:
        uVar17 = (uint)(uVar10 < uVar20);
      }
      else {
        print_error("Failed finding files under path \"%s\"!\n",pcVar19);
        uVar17 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&files);
      return uVar17;
    }
    if ((long)uVar10 >> 5 == 0) {
      pcVar19 = "No directory specified!\n";
      goto LAB_0010aa15;
    }
  }
  else if (iVar6 == 1) {
    if (uVar10 < 0x21) {
LAB_0010a8fc:
      pcVar19 = "Must specify input and output filenames!\n";
      goto LAB_0010aa15;
    }
    if (uVar10 == 0x40) {
      options_00.m_verify_compressed_data = options.m_verify_compressed_data;
      options_00.m_unbuffered_decompression = options.m_unbuffered_decompression;
      options_00.m_force_polar_codes = options.m_force_polar_codes;
      options_00.m_randomize_params = options.m_randomize_params;
      options_00.m_extreme_parsing = options.m_extreme_parsing;
      options_00.m_deterministic_parsing = options.m_deterministic_parsing;
      options_00._22_2_ = options._22_2_;
      options_00.m_max_helper_threads = options.m_max_helper_threads;
      options_00.m_compute_adler32_during_decomp = options.m_compute_adler32_during_decomp;
      options_00._9_3_ = options._9_3_;
      options_00.m_comp_level = options.m_comp_level;
      options_00.m_dict_size_log2 = options.m_dict_size_log2;
      bVar4 = decompress_file(local_8c0,(pbVar9->_M_dataplus)._M_p,pbVar9[1]._M_dataplus._M_p,
                              options_00);
      return (uint)!bVar4;
    }
  }
  else {
    if (uVar10 < 0x21) goto LAB_0010a8fc;
    if (uVar10 == 0x40) {
      bVar4 = compress_streaming(local_8c0,(pbVar9->_M_dataplus)._M_p,pbVar9[1]._M_dataplus._M_p,
                                 &options);
      if (!bVar4) {
        return 1;
      }
      if (options.m_verify_compressed_data == true) {
        dVar2 = timer::get_ms();
        sprintf((char *)cmp_buf,"__decomp_temp_%u__.tmp",(long)dVar2);
        options_01.m_verify_compressed_data = options.m_verify_compressed_data;
        options_01.m_unbuffered_decompression = options.m_unbuffered_decompression;
        options_01.m_force_polar_codes = options.m_force_polar_codes;
        options_01.m_randomize_params = options.m_randomize_params;
        options_01.m_extreme_parsing = options.m_extreme_parsing;
        options_01.m_deterministic_parsing = options.m_deterministic_parsing;
        options_01._22_2_ = options._22_2_;
        options_01.m_max_helper_threads = options.m_max_helper_threads;
        options_01.m_compute_adler32_during_decomp = options.m_compute_adler32_during_decomp;
        options_01._9_3_ = options._9_3_;
        options_01.m_comp_level = options.m_comp_level;
        options_01.m_dict_size_log2 = options.m_dict_size_log2;
        bVar4 = decompress_file(piVar3,pbVar9[1]._M_dataplus._M_p,(char *)cmp_buf,options_01);
        if (bVar4) {
          printf("Comparing file \"%s\" to \"%s\"\n",cmp_buf,(pbVar9->_M_dataplus)._M_p);
          bVar4 = compare_files((char *)cmp_buf,(pbVar9->_M_dataplus)._M_p);
          if (bVar4) {
            puts("Decompressed file compared OK to original file.");
            remove((char *)cmp_buf);
            return 0;
          }
          pcVar18 = (pbVar9->_M_dataplus)._M_p;
          plVar16 = (lzham_uint8 *)pbVar9[1]._M_dataplus._M_p;
          pcVar19 = "Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n";
        }
        else {
          pcVar18 = pbVar9[1]._M_dataplus._M_p;
          pcVar19 = "Failed decompressing file \"%s\" to \"%s\"\n";
          plVar16 = cmp_buf;
        }
        print_error(pcVar19,pcVar18,plVar16);
        return 1;
      }
      return 0;
    }
  }
  pcVar19 = "Too many filenames!\n";
LAB_0010aa15:
  print_error(pcVar19);
  return 1;
}

Assistant:

int main_internal(string_array cmd_line, int num_helper_threads, ilzham &lzham_dll)
{
   comp_options options;
   options.m_max_helper_threads = num_helper_threads;

#ifdef _XBOX
   options.m_dict_size_log2 = 21;
#endif

   if (!cmd_line.size())
   {
      print_usage();
      return simple_test(lzham_dll, options);
   }

   enum op_mode_t
   {
      OP_MODE_INVALID = -1,
      OP_MODE_COMPRESS = 0,
      OP_MODE_DECOMPRESS = 1,
      OP_MODE_ALL = 2
   };

   op_mode_t op_mode = OP_MODE_INVALID;

   for (int i = 0; i < (int)cmd_line.size(); i++)
   {
      const std::string &str = cmd_line[i];
      if (str[0] == '-')
      {
         if (str.size() < 2)
         {
            print_error("Invalid option: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
         switch (tolower(str[1]))
         {
            case 'u':
            {
               options.m_unbuffered_decompression = true;
               break;
            }
            case 'd':
            {
               int dict_size = atoi(str.c_str() + 2);
               if ((dict_size < LZHAM_MIN_DICT_SIZE_LOG2) || (dict_size > LZHAMTEST_MAX_POSSIBLE_DICT_SIZE))
               {
                  print_error("Invalid dictionary size: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_dict_size_log2 = dict_size;
               break;
            }
            case 'm':
            {
               int comp_level = atoi(str.c_str() + 2);
               if ((comp_level < 0) || (comp_level > (int)LZHAM_COMP_LEVEL_UBER))
               {
                  print_error("Invalid compression level: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_comp_level = static_cast<lzham_compress_level>(comp_level);
               break;
            }
            case 't':
            {
               int num_threads = atoi(str.c_str() + 2);
               if ((num_threads < 0) || (num_threads > LZHAM_MAX_HELPER_THREADS))
               {
                  print_error("Invalid number of helper threads: %s\n", str.c_str());
                  return EXIT_FAILURE;
               }
               options.m_max_helper_threads = num_threads;
               break;
            }
            case 'c':
            {
               options.m_compute_adler32_during_decomp = false;
               break;
            }
            case 'v':
            {
               options.m_verify_compressed_data = true;
               break;
            }
            case 'r':
            {
               options.m_randomize_params = true;
               break;
            }
            case 'p':
            {
               options.m_force_polar_codes = true;
               break;
            }
            case 'x':
            {
               options.m_extreme_parsing = true;
               break;
            }
            case 'e':
            {
               options.m_deterministic_parsing = true;
               break;
            }
            case 's':
            {
               int seed = atoi(str.c_str() + 2);
               srand(seed);
               printf("Using random seed: %i\n", seed);
               break;
            }
            default:
            {
               print_error("Invalid option: %s\n", str.c_str());
               return EXIT_FAILURE;
            }
         }

         cmd_line.erase(cmd_line.begin() + i);
         i--;

         continue;
      }

      if (str.size() != 1)
      {
         print_error("Invalid mode: %s\n", str.c_str());
         return EXIT_FAILURE;
      }
      switch (tolower(str[0]))
      {
         case 'c':
         {
            op_mode = OP_MODE_COMPRESS;
            break;
         }
         case 'd':
         {
            op_mode = OP_MODE_DECOMPRESS;
            break;
         }
         case 'a':
         {
            op_mode = OP_MODE_ALL;
            break;
         }
         default:
         {
            print_error("Invalid mode: %s\n", str.c_str());
            return EXIT_FAILURE;
         }
      }
      cmd_line.erase(cmd_line.begin() + i);
      break;
   }

   if (op_mode == OP_MODE_INVALID)
   {
      print_error("No mode specified!\n");
      print_usage();
      return EXIT_FAILURE;
   }

   printf("Using options:\n");
   options.print();
   printf("\n");

   int exit_status = EXIT_FAILURE;

   switch (op_mode)
   {
      case OP_MODE_COMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }

         const std::string &src_file = cmd_line[0];
         const std::string &cmp_file = cmd_line[1];

         bool comp_result = compress_streaming(lzham_dll, src_file.c_str(), cmp_file.c_str(), options);
         if (comp_result)
            exit_status = EXIT_SUCCESS;

         if ((comp_result) && (options.m_verify_compressed_data))
         {
            char decomp_file[256];

#ifdef _XBOX
            sprintf(decomp_file, "e:\\__decomp_temp_%u__.tmp", (uint)GetTickCount());
#else
            sprintf(decomp_file, "__decomp_temp_%u__.tmp", (uint)timer::get_ms());
#endif
            if (!decompress_file(lzham_dll, cmp_file.c_str(), decomp_file, options))
            {
               print_error("Failed decompressing file \"%s\" to \"%s\"\n", cmp_file.c_str(), decomp_file);
               return EXIT_FAILURE;
            }

            printf("Comparing file \"%s\" to \"%s\"\n", decomp_file, src_file.c_str());

            if (!compare_files(decomp_file, src_file.c_str()))
            {
               print_error("Failed comparing decompressed file data while compressing \"%s\" to \"%s\"\n", src_file.c_str(), cmp_file.c_str());
               return EXIT_FAILURE;
            }
            else
            {
               printf("Decompressed file compared OK to original file.\n");
            }

            remove(decomp_file);
         }

         break;
      }
      case OP_MODE_DECOMPRESS:
      {
         if (cmd_line.size() < 2)
         {
            print_error("Must specify input and output filenames!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() > 2)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (decompress_file(lzham_dll, cmd_line[0].c_str(), cmd_line[1].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      case OP_MODE_ALL:
      {
         if (!cmd_line.size())
         {
            print_error("No directory specified!\n");
            return EXIT_FAILURE;
         }
         else if (cmd_line.size() != 1)
         {
            print_error("Too many filenames!\n");
            return EXIT_FAILURE;
         }
         if (test_recursive(lzham_dll, cmd_line[0].c_str(), options))
            exit_status = EXIT_SUCCESS;
         break;
      }
      default:
      {
         print_error("No mode specified!\n");
         print_usage();
         return EXIT_FAILURE;
      }
   }

   return exit_status;
}